

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelDefinesByProperties::~IfcRelDefinesByProperties
          (IfcRelDefinesByProperties *this)

{
  ~IfcRelDefinesByProperties
            ((IfcRelDefinesByProperties *)
             (&(this->super_IfcRelDefines).field_0x0 +
             *(long *)(*(long *)&this->super_IfcRelDefines + -0x18)));
  return;
}

Assistant:

IfcRelDefinesByProperties() : Object("IfcRelDefinesByProperties") {}